

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.cpp
# Opt level: O2

uint __thiscall glsl_type::std140_size(glsl_type *this,bool row_major)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  glsl_type *pgVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  
  uVar5 = (uint)row_major;
  while( true ) {
    bVar2 = is_64bit(this);
    if (((this->vector_elements == '\x01') && ((*(uint *)&this->field_0x4 & 0xfe) < 0xe)) ||
       (bVar3 = is_vector(this), bVar3)) {
      if (this->explicit_stride == 0) {
        return (uint)this->vector_elements << (bVar2 | 2U);
      }
      __assert_fail("this->explicit_stride == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.cpp"
                    ,0x71f,"unsigned int glsl_type::std140_size(bool) const");
    }
    pgVar6 = without_array(this);
    bVar7 = this->field_0x4;
    if ((pgVar6->matrix_columns < 2) || (2 < (byte)pgVar6->field_0x4 - 2)) break;
    uVar4 = 1;
    if (bVar7 == 0x11) {
      pgVar6 = without_array(this);
      uVar4 = arrays_of_arrays_size(this);
      this = pgVar6;
    }
    uVar12 = uVar5 & 1;
    uVar5 = 0;
    pgVar6 = get_instance((uint)(byte)this->field_0x4,(uint)(&this->vector_elements)[uVar12],1,0,
                          false);
    this = get_array_instance(pgVar6,*(byte *)((long)&this->gl_type + ((ulong)uVar12 ^ 9)) * uVar4,0
                             );
  }
  if (bVar7 - 0xf < 2) {
    uVar4 = 0;
    lVar11 = 0x20;
    uVar12 = 0;
    for (uVar9 = 1; uVar9 - 1 < (ulong)this->length; uVar9 = uVar9 + 1) {
      uVar8 = *(uint *)((long)&((this->fields).array)->gl_type + lVar11) >> 5 & 3;
      if (uVar8 == 2) {
        bVar7 = 1;
      }
      else {
        bVar7 = (byte)uVar5;
        if (uVar8 == 1) {
          bVar7 = 0;
        }
      }
      pgVar6 = *(glsl_type **)((long)(this->fields).array + lVar11 + -0x20);
      uVar8 = std140_base_alignment(pgVar6,(bool)(bVar7 & 1));
      if ((pgVar6->field_0x4 != '\x11') || (pgVar6->length != 0)) {
        uVar10 = (uVar4 + uVar8) - 1;
        uVar4 = std140_size(pgVar6,(bool)(bVar7 & 1));
        uVar4 = uVar4 + (uVar10 - uVar10 % uVar8);
        if (uVar12 < uVar8) {
          uVar12 = uVar8;
        }
        if ((pgVar6->field_0x4 == '\x0f') && (uVar9 < this->length)) {
          uVar4 = uVar4 + 0xf & 0xfffffff0;
        }
      }
      lVar11 = lVar11 + 0x30;
    }
    uVar9 = 0x10;
    if (0x10 < uVar12) {
      uVar9 = (ulong)uVar12;
    }
    uVar4 = (uVar4 + (int)uVar9) - 1;
    uVar4 = uVar4 - (int)((ulong)uVar4 % uVar9);
  }
  else {
    if (bVar7 != 0x11) {
      __assert_fail("!\"not reached\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.cpp"
                    ,0x799,"unsigned int glsl_type::std140_size(bool) const");
    }
    pgVar6 = without_array(this);
    cVar1 = pgVar6->field_0x4;
    pgVar6 = without_array(this);
    bVar2 = (bool)((byte)uVar5 & 1);
    if (cVar1 == '\x0f') {
      uVar5 = std140_size(pgVar6,bVar2);
    }
    else {
      uVar4 = std140_base_alignment(pgVar6,bVar2);
      uVar5 = 0x10;
      if (0x10 < uVar4) {
        uVar5 = uVar4;
      }
    }
    uVar4 = arrays_of_arrays_size(this);
    uVar4 = uVar4 * uVar5;
    if ((this->explicit_stride != 0) && (uVar4 != this->explicit_stride * this->length)) {
      __assert_fail("this->explicit_stride == 0 || size == this->length * this->explicit_stride",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.cpp"
                    ,0x768,"unsigned int glsl_type::std140_size(bool) const");
    }
  }
  return uVar4;
}

Assistant:

unsigned
glsl_type::std140_size(bool row_major) const
{
   unsigned N = is_64bit() ? 8 : 4;

   /* (1) If the member is a scalar consuming <N> basic machine units, the
    *     base alignment is <N>.
    *
    * (2) If the member is a two- or four-component vector with components
    *     consuming <N> basic machine units, the base alignment is 2<N> or
    *     4<N>, respectively.
    *
    * (3) If the member is a three-component vector with components consuming
    *     <N> basic machine units, the base alignment is 4<N>.
    */
   if (this->is_scalar() || this->is_vector()) {
      assert(this->explicit_stride == 0);
      return this->vector_elements * N;
   }

   /* (5) If the member is a column-major matrix with <C> columns and
    *     <R> rows, the matrix is stored identically to an array of
    *     <C> column vectors with <R> components each, according to
    *     rule (4).
    *
    * (6) If the member is an array of <S> column-major matrices with <C>
    *     columns and <R> rows, the matrix is stored identically to a row of
    *     <S>*<C> column vectors with <R> components each, according to rule
    *     (4).
    *
    * (7) If the member is a row-major matrix with <C> columns and <R>
    *     rows, the matrix is stored identically to an array of <R>
    *     row vectors with <C> components each, according to rule (4).
    *
    * (8) If the member is an array of <S> row-major matrices with <C> columns
    *     and <R> rows, the matrix is stored identically to a row of <S>*<R>
    *     row vectors with <C> components each, according to rule (4).
    */
   if (this->without_array()->is_matrix()) {
      const struct glsl_type *element_type;
      const struct glsl_type *vec_type;
      unsigned int array_len;

      if (this->is_array()) {
         element_type = this->without_array();
         array_len = this->arrays_of_arrays_size();
      } else {
         element_type = this;
         array_len = 1;
      }

      if (row_major) {
         vec_type = get_instance(element_type->base_type,
                                 element_type->matrix_columns, 1);

         array_len *= element_type->vector_elements;
      } else {
         vec_type = get_instance(element_type->base_type,
                                 element_type->vector_elements, 1);
         array_len *= element_type->matrix_columns;
      }
      const glsl_type *array_type = glsl_type::get_array_instance(vec_type,
                                                                  array_len);

      return array_type->std140_size(false);
   }

   /* (4) If the member is an array of scalars or vectors, the base alignment
    *     and array stride are set to match the base alignment of a single
    *     array element, according to rules (1), (2), and (3), and rounded up
    *     to the base alignment of a vec4. The array may have padding at the
    *     end; the base offset of the member following the array is rounded up
    *     to the next multiple of the base alignment.
    *
    * (10) If the member is an array of <S> structures, the <S> elements of
    *      the array are laid out in order, according to rule (9).
    */
   if (this->is_array()) {
      unsigned stride;
      if (this->without_array()->is_struct()) {
	 stride = this->without_array()->std140_size(row_major);
      } else {
	 unsigned element_base_align =
	    this->without_array()->std140_base_alignment(row_major);
         stride = MAX2(element_base_align, 16);
      }

      unsigned size = this->arrays_of_arrays_size() * stride;
      assert(this->explicit_stride == 0 ||
             size == this->length * this->explicit_stride);
      return size;
   }

   /* (9) If the member is a structure, the base alignment of the
    *     structure is <N>, where <N> is the largest base alignment
    *     value of any of its members, and rounded up to the base
    *     alignment of a vec4. The individual members of this
    *     sub-structure are then assigned offsets by applying this set
    *     of rules recursively, where the base offset of the first
    *     member of the sub-structure is equal to the aligned offset
    *     of the structure. The structure may have padding at the end;
    *     the base offset of the member following the sub-structure is
    *     rounded up to the next multiple of the base alignment of the
    *     structure.
    */
   if (this->is_struct() || this->is_interface()) {
      unsigned size = 0;
      unsigned max_align = 0;

      for (unsigned i = 0; i < this->length; i++) {
         bool field_row_major = row_major;
         const enum glsl_matrix_layout matrix_layout =
            glsl_matrix_layout(this->fields.structure[i].matrix_layout);
         if (matrix_layout == GLSL_MATRIX_LAYOUT_ROW_MAJOR) {
            field_row_major = true;
         } else if (matrix_layout == GLSL_MATRIX_LAYOUT_COLUMN_MAJOR) {
            field_row_major = false;
         }

         const struct glsl_type *field_type = this->fields.structure[i].type;
         unsigned align = field_type->std140_base_alignment(field_row_major);

         /* Ignore unsized arrays when calculating size */
         if (field_type->is_unsized_array())
            continue;

         size = glsl_align(size, align);
         size += field_type->std140_size(field_row_major);

         max_align = MAX2(align, max_align);

         if (field_type->is_struct() && (i + 1 < this->length))
            size = glsl_align(size, 16);
      }
      size = glsl_align(size, MAX2(max_align, 16));
      return size;
   }

   assert(!"not reached");
   return -1;
}